

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O0

void __thiscall
miniros::ServiceClientLink::onRequestLength
          (ServiceClientLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  uint *puVar1;
  element_type *this_00;
  size_t __nbytes;
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  LogLocation *in_RDI;
  byte in_R8B;
  Connection *unaff_retaddr;
  bool enabled;
  uint32_t len;
  undefined8 in_stack_ffffffffffffff38;
  Level level;
  LogLocation *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint __fd;
  Level in_stack_ffffffffffffff64;
  string *name;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined1 local_49 [37];
  uint local_24;
  byte local_1d;
  LogLocation *pLVar2;
  DropReason reason;
  
  level = (Level)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_1d = in_R8B & 1;
  if (local_1d != 0) {
    pLVar2 = in_RDI;
    puVar1 = (uint *)std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::get(in_RDX);
    reason = (DropReason)((ulong)pLVar2 >> 0x20);
    local_24 = *puVar1;
    if (local_24 < 0x3b9aca01) {
      this_00 = std::
                __shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4a71fb);
      __nbytes = (size_t)local_24;
      __fd = local_24;
      std::
      function<void(std::shared_ptr<miniros::Connection>const&,std::shared_ptr<unsigned_char[]>const&,unsigned_int,bool)>
      ::
      function<miniros::ServiceClientLink::onRequestLength(std::shared_ptr<miniros::Connection>const&,std::shared_ptr<unsigned_char[]>const&,unsigned_int,bool)::__0,void>
                ((function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
                  *)CONCAT44(local_24,in_stack_ffffffffffffff50),(anon_class_8_1_8991fb9c *)this_00)
      ;
      Connection::read(this_00,__fd,&stack0xffffffffffffff80,__nbytes);
      std::
      function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
      ::~function((function<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool)>
                   *)0x4a724b);
    }
    else {
      if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((onRequestLength::loc.initialized_ ^ 0xffU) & 1) != 0) {
        name = (string *)local_49;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(allocator<char> *)in_RDI);
        console::initializeLogLocation(in_RDI,name,in_stack_ffffffffffffff64);
        std::__cxx11::string::~string((string *)(local_49 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_49);
      }
      if (onRequestLength::loc.level_ != Error) {
        console::setLogLocationLevel(in_stack_ffffffffffffff40,level);
        console::checkLogLocationEnabled
                  ((LogLocation *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
      if ((onRequestLength::loc.logger_enabled_ & 1U) != 0) {
        console::print((FilterBase *)0x0,onRequestLength::loc.logger_,
                       (Level)(ulong)onRequestLength::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp"
                       ,0xdd,
                       "void miniros::ServiceClientLink::onRequestLength(const ConnectionPtr &, const std::shared_ptr<uint8_t[]> &, uint32_t, bool)"
                       ,
                       "a message of over a gigabyte was predicted in tcpros. that seems highly unlikely, so I\'ll assume protocol synchronization is lost."
                      );
      }
      std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4a71de);
      Connection::drop(unaff_retaddr,reason);
    }
  }
  return;
}

Assistant:

void ServiceClientLink::onRequestLength(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)size;
  if (!success)
    return;

  MINIROS_ASSERT(conn == connection_);
  MINIROS_ASSERT(size == 4);

  uint32_t len = *((uint32_t*)buffer.get());

  if (len > 1000000000)
  {
    MINIROS_ERROR("a message of over a gigabyte was " \
                "predicted in tcpros. that seems highly " \
                "unlikely, so I'll assume protocol " \
                "synchronization is lost.");
    conn->drop(Connection::Destructing);
    return;
  }

  connection_->read(len,
      [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
      {
          this->onRequest(conn, buffer, size, success);
      });
}